

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DTDElementDecl.cpp
# Opt level: O0

void __thiscall xercesc_4_0::DTDElementDecl::faultInAttDefList(DTDElementDecl *this)

{
  MemoryManager *pMVar1;
  RefHashTableOf<xercesc_4_0::DTDAttDef,_xercesc_4_0::StringHasher> *this_00;
  DTDElementDecl *this_local;
  
  pMVar1 = XMLElementDecl::getMemoryManager(&this->super_XMLElementDecl);
  this_00 = (RefHashTableOf<xercesc_4_0::DTDAttDef,_xercesc_4_0::StringHasher> *)
            XMemory::operator_new(0x38,pMVar1);
  pMVar1 = XMLElementDecl::getMemoryManager(&this->super_XMLElementDecl);
  RefHashTableOf<xercesc_4_0::DTDAttDef,_xercesc_4_0::StringHasher>::RefHashTableOf
            (this_00,0x1d,true,pMVar1);
  this->fAttDefs = this_00;
  return;
}

Assistant:

void DTDElementDecl::faultInAttDefList() const
{
    // Use a hash modulus of 29 and tell it owns its elements
    ((DTDElementDecl*)this)->fAttDefs = new (getMemoryManager()) RefHashTableOf<DTDAttDef>(29, true, getMemoryManager());
}